

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O3

void __thiscall QPrintPreviewDialogPrivate::updateZoomFactor(QPrintPreviewDialogPrivate *this)

{
  QString *pQVar1;
  QPrintPreviewDialogPrivate *in_RSI;
  long in_FS_OFFSET;
  qreal qVar2;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QString *)QComboBox::lineEdit();
  qVar2 = QPrintPreviewWidget::zoomFactor((QPrintPreviewWidget *)this->preview);
  formattedZoomFactor(&local_30,in_RSI,qVar2 * 100.0);
  QLineEdit::setText(pQVar1);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewDialogPrivate::updateZoomFactor()
{
    zoomFactor->lineEdit()->setText(formattedZoomFactor(preview->zoomFactor() * 100));
}